

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O3

int32_t WebRtcIsac_InitBandwidthEstimator
                  (BwEstimatorstr *bwest_str,IsacSamplingRate encoderSampRate,
                  IsacSamplingRate decoderSampRate)

{
  int32_t iVar1;
  int32_t iVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  
  if (encoderSampRate == kIsacWideband) {
    fVar3 = 20000.0;
LAB_00151814:
    bwest_str->send_bw_avg = fVar3;
  }
  else if (encoderSampRate == kIsacSuperWideband) {
    fVar3 = 56000.0;
    goto LAB_00151814;
  }
  if (decoderSampRate == kIsacWideband) {
    uVar4 = 0x382a0a13;
    uVar5 = 0x46c0b555;
    fVar3 = 4666.6665;
    fVar6 = 20000.0;
    iVar1 = 20000;
    iVar2 = 0x3c;
  }
  else {
    if (decoderSampRate != kIsacSuperWideband) goto LAB_0015187c;
    uVar4 = 0x378065a6;
    uVar5 = 0x477f3555;
    fVar3 = 9333.333;
    fVar6 = 56000.0;
    iVar1 = 56000;
    iVar2 = 0x1e;
  }
  bwest_str->prev_frame_length = iVar2;
  bwest_str->rec_bw = iVar1;
  bwest_str->rec_bw_avg_Q = fVar6;
  bwest_str->rec_bw_inv = (float)uVar4;
  bwest_str->rec_bw_avg = (float)uVar5;
  bwest_str->rec_header_rate = fVar3;
LAB_0015187c:
  bwest_str->prev_rec_rtp_number = 0;
  bwest_str->prev_rec_send_ts = 0;
  bwest_str->prev_rec_arr_ts = 0;
  bwest_str->prev_rec_rtp_rate = 1.0;
  bwest_str->last_update_ts = 0;
  bwest_str->last_reduction_ts = 0;
  bwest_str->count_tot_updates_rec = -9;
  bwest_str->rec_jitter = 10.0;
  bwest_str->rec_jitter_short_term = 0.0;
  bwest_str->rec_jitter_short_term_abs = 5.0;
  bwest_str->rec_max_delay = 10.0;
  bwest_str->rec_max_delay_avg_Q = 10.0;
  bwest_str->send_max_delay_avg = 10.0;
  bwest_str->num_pkts_rec = 0;
  bwest_str->consecLatency = 0.0;
  bwest_str->inWaitLatePkts = 0;
  (bwest_str->external_bw_info).in_use = 0;
  bwest_str->num_consec_rec_pkts_over_30k = 0;
  bwest_str->hsn_detect_rec = 0;
  bwest_str->num_consec_snt_pkts_over_30k = 0;
  bwest_str->hsn_detect_snd = 0;
  bwest_str->in_wait_period = 0;
  bwest_str->change_to_WB = 0;
  bwest_str->senderTimestamp = 0;
  bwest_str->receiverTimestamp = 0;
  bwest_str->numConsecLatePkts = 0;
  return 0;
}

Assistant:

int32_t WebRtcIsac_InitBandwidthEstimator(
    BwEstimatorstr*              bwest_str,
    enum IsacSamplingRate encoderSampRate,
    enum IsacSamplingRate decoderSampRate)
{
  switch(encoderSampRate)
  {
    case kIsacWideband:
      {
        bwest_str->send_bw_avg       = INIT_BN_EST_WB;
        break;
      }
    case kIsacSuperWideband:
      {
        bwest_str->send_bw_avg       = INIT_BN_EST_SWB;
        break;
      }
  }

  switch(decoderSampRate)
  {
    case kIsacWideband:
      {
        bwest_str->prev_frame_length = INIT_FRAME_LEN_WB;
        bwest_str->rec_bw_inv        = 1.0f /
            (INIT_BN_EST_WB + INIT_HDR_RATE_WB);
        bwest_str->rec_bw            = (int32_t)INIT_BN_EST_WB;
        bwest_str->rec_bw_avg_Q      = INIT_BN_EST_WB;
        bwest_str->rec_bw_avg        = INIT_BN_EST_WB + INIT_HDR_RATE_WB;
        bwest_str->rec_header_rate   = INIT_HDR_RATE_WB;
        break;
      }
    case kIsacSuperWideband:
      {
        bwest_str->prev_frame_length = INIT_FRAME_LEN_SWB;
        bwest_str->rec_bw_inv        = 1.0f /
            (INIT_BN_EST_SWB + INIT_HDR_RATE_SWB);
        bwest_str->rec_bw            = (int32_t)INIT_BN_EST_SWB;
        bwest_str->rec_bw_avg_Q      = INIT_BN_EST_SWB;
        bwest_str->rec_bw_avg        = INIT_BN_EST_SWB + INIT_HDR_RATE_SWB;
        bwest_str->rec_header_rate   = INIT_HDR_RATE_SWB;
        break;
      }
  }

  bwest_str->prev_rec_rtp_number       = 0;
  bwest_str->prev_rec_arr_ts           = 0;
  bwest_str->prev_rec_send_ts          = 0;
  bwest_str->prev_rec_rtp_rate         = 1.0f;
  bwest_str->last_update_ts            = 0;
  bwest_str->last_reduction_ts         = 0;
  bwest_str->count_tot_updates_rec     = -9;
  bwest_str->rec_jitter                = 10.0f;
  bwest_str->rec_jitter_short_term     = 0.0f;
  bwest_str->rec_jitter_short_term_abs = 5.0f;
  bwest_str->rec_max_delay             = 10.0f;
  bwest_str->rec_max_delay_avg_Q       = 10.0f;
  bwest_str->num_pkts_rec              = 0;

  bwest_str->send_max_delay_avg        = 10.0f;

  bwest_str->hsn_detect_rec = 0;

  bwest_str->num_consec_rec_pkts_over_30k = 0;

  bwest_str->hsn_detect_snd = 0;

  bwest_str->num_consec_snt_pkts_over_30k = 0;

  bwest_str->in_wait_period = 0;

  bwest_str->change_to_WB = 0;

  bwest_str->numConsecLatePkts = 0;
  bwest_str->consecLatency = 0;
  bwest_str->inWaitLatePkts = 0;
  bwest_str->senderTimestamp = 0;
  bwest_str->receiverTimestamp = 0;

  bwest_str->external_bw_info.in_use = 0;

  return 0;
}